

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.cpp
# Opt level: O2

void __thiscall
r_exec::AutoFocusController::dispatch_pred_success
          (AutoFocusController *this,_Fact *predicted_f,TPXMap *map)

{
  __node_base *p_Var1;
  
  p_Var1 = &(map->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    (*(code *)(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor)->
              _M_nxt[4]._M_nxt)
              (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor,
               predicted_f);
  }
  return;
}

Assistant:

inline void AutoFocusController::dispatch_pred_success(_Fact *predicted_f, TPXMap &map)
{
    TPXMap::const_iterator m;

    for (m = map.begin(); m != map.end(); ++m) {
        m->second->ack_pred_success(predicted_f);
    }
}